

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  reference pbVar5;
  reference pvVar6;
  streambuf *psVar7;
  ulong uVar8;
  element_type *peVar9;
  long lVar10;
  exception *ex_1;
  string local_800;
  Reader local_7e0;
  undefined1 local_710 [8];
  SuperCellInfo si;
  exception *ex;
  undefined1 local_698 [8];
  shared_ptr<CIF::Reader> cif;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  allocator local_5d9;
  string local_5d8;
  string local_5b8;
  string local_598 [8];
  string file;
  stringstream ss;
  ostream local_568 [376];
  undefined1 local_3f0 [8];
  ifstream test_stream;
  string *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  non_option_args;
  exception *ex_5;
  string local_1a0;
  exception *ex_4;
  string local_170;
  exception *ex_3;
  string local_140;
  exception *ex_2;
  string local_110;
  undefined4 local_ec;
  undefined4 local_e8;
  byte local_e1;
  int option_index;
  bool valid;
  double gamma;
  double beta;
  double alpha;
  double z;
  double y;
  double x;
  double c;
  double b;
  double a;
  double w;
  double v;
  double u;
  string local_78 [8];
  string input_cif;
  allocator local_41;
  string local_40 [8];
  string output_xyz;
  int cc;
  bool fix;
  char **argv_local;
  int argc_local;
  
  verbose_flag = 0;
  output_xyz.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",(allocator *)((long)&u + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&u + 7));
  _option_index = 0.0;
  gamma = 0.0;
  beta = 0.0;
  alpha = 0.0;
  z = 0.0;
  y = 0.0;
  x = 0.0;
  c = 0.0;
  b = 0.0;
  a = 0.0;
  w = 0.0;
  v = 0.0;
  local_e1 = 1;
LAB_001d4923:
  do {
    do {
      local_e8 = 0;
      output_xyz.field_2._8_4_ = getopt_long(argc,argv,"fhvz:d:o:n:t:",main::long_options,&local_e8)
      ;
      pcVar1 = _optarg;
      if (output_xyz.field_2._8_4_ == -1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
        while (_optind < argc) {
          lVar10 = (long)_optind;
          _optind = _optind + 1;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                     argv + lVar10);
        }
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
        if (sVar3 == 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "Error: Need one non-option argument (the input .cif)");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_e1 = 0;
        }
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
        if (1 < sVar3) {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "Error: Only expecting one non-option argument (the input .cif). Instead got:"
                                  );
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          __end2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2);
          s = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&s), bVar2) {
            pbVar5 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&__end2);
            poVar4 = std::operator<<((ostream *)&std::cerr,"\t");
            poVar4 = std::operator<<(poVar4,(string *)pbVar5);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end2);
          }
          local_e1 = 0;
        }
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
        if (sVar3 == 1) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&__range2,0);
          std::__cxx11::string::operator=(local_78,(string *)pvVar6);
        }
        if (((((v == 0.0) && (!NAN(v))) && (w == 0.0)) && ((!NAN(w) && (a == 0.0)))) && (!NAN(a))) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Did not get valid zone axis");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_e1 = 0;
        }
        if (((y <= 0.0) || (z <= 0.0)) || (alpha <= 0.0)) {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "Error: Did not get valid superstructure dimensions");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_e1 = 0;
        }
        std::ifstream::ifstream(local_3f0,local_78,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)(file.field_2._M_local_buf + 8));
        psVar7 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_568,psVar7);
        std::ifstream::close();
        std::__cxx11::stringstream::str();
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Invalid input .cif file");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_e1 = 0;
        }
        if ((local_e1 & 1) == 0) {
          argv_local._4_4_ = 1;
          local_ec = 1;
        }
        else {
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) != 0) {
            std::__cxx11::string::operator=(local_40,local_78);
            std::__cxx11::string::string((string *)&local_5b8,local_40);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_5d8,".cif",&local_5d9);
            bVar2 = endsWith(&local_5b8,&local_5d8);
            std::__cxx11::string::~string((string *)&local_5d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
            std::__cxx11::string::~string((string *)&local_5b8);
            if (bVar2) {
              std::__cxx11::string::string((string *)&local_640,local_40);
              removeEnd(&local_620,&local_640,4);
              std::operator+(&local_600,&local_620,".xyz");
              std::__cxx11::string::operator=(local_40,(string *)&local_600);
              std::__cxx11::string::~string((string *)&local_600);
              std::__cxx11::string::~string((string *)&local_620);
              std::__cxx11::string::~string((string *)&local_640);
            }
          }
          std::__cxx11::string::string((string *)&local_660,local_40);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_680,".xyz",
                     (allocator *)
                     ((long)&cif.super___shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
          bVar2 = endsWith(&local_660,&local_680);
          std::__cxx11::string::~string((string *)&local_680);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&cif.super___shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
          std::__cxx11::string::~string((string *)&local_660);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            std::__cxx11::string::operator+=(local_40,".xyz");
          }
          if (verbose_flag != 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Verbose flag is set");
            poVar4 = (ostream *)
                     std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
          std::shared_ptr<CIF::Reader>::shared_ptr((shared_ptr<CIF::Reader> *)local_698);
          std::make_shared<CIF::Reader,std::__cxx11::string&,bool&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ex,
                     (bool *)local_78);
          std::shared_ptr<CIF::Reader>::operator=
                    ((shared_ptr<CIF::Reader> *)local_698,(shared_ptr<CIF::Reader> *)&ex);
          std::shared_ptr<CIF::Reader>::~shared_ptr((shared_ptr<CIF::Reader> *)&ex);
          CIF::SuperCellInfo::SuperCellInfo((SuperCellInfo *)local_710);
          CIF::SuperCellInfo::setUVW((SuperCellInfo *)local_710,v,w,a);
          CIF::SuperCellInfo::setABC((SuperCellInfo *)local_710,b,c,x);
          CIF::SuperCellInfo::setWidths((SuperCellInfo *)local_710,y,z,alpha);
          CIF::SuperCellInfo::setTilts((SuperCellInfo *)local_710,beta,gamma,_option_index);
          peVar9 = std::__shared_ptr_access<CIF::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*((__shared_ptr_access<CIF::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_698);
          CIF::Reader::Reader(&local_7e0,peVar9);
          std::__cxx11::string::string((string *)&local_800,local_40);
          CIF::SuperCellInfo::SuperCellInfo((SuperCellInfo *)&ex_1,(SuperCellInfo *)local_710);
          makeXYZ(&local_7e0,&local_800,(SuperCellInfo *)&ex_1);
          std::__cxx11::string::~string((string *)&local_800);
          CIF::Reader::~Reader(&local_7e0);
          argv_local._4_4_ = 0;
          local_ec = 1;
          std::shared_ptr<CIF::Reader>::~shared_ptr((shared_ptr<CIF::Reader> *)local_698);
        }
        std::__cxx11::string::~string(local_598);
        std::__cxx11::stringstream::~stringstream((stringstream *)(file.field_2._M_local_buf + 8));
        std::ifstream::~ifstream(local_3f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2);
LAB_001d5af1:
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_40);
        return argv_local._4_4_;
      }
    } while ((output_xyz.field_2._8_4_ == 0) || (output_xyz.field_2._8_4_ == 0x3f));
    if (output_xyz.field_2._8_4_ != 100) {
      if (output_xyz.field_2._8_4_ == 0x66) {
        output_xyz.field_2._M_local_buf[0xf] = '\x01';
      }
      else {
        if (output_xyz.field_2._8_4_ == 0x68) {
          printHelp();
          argv_local._4_4_ = 0;
          local_ec = 1;
          goto LAB_001d5af1;
        }
        if (output_xyz.field_2._8_4_ == 0x6e) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_140,pcVar1,(allocator *)((long)&ex_3 + 7));
          parseThreeCommaList<double>(&local_140,&b,&c,&x);
          std::__cxx11::string::~string((string *)&local_140);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ex_3 + 7));
        }
        else if (output_xyz.field_2._8_4_ == 0x6f) {
          std::__cxx11::string::operator=(local_40,_optarg);
        }
        else if (output_xyz.field_2._8_4_ == 0x74) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_170,pcVar1,(allocator *)((long)&ex_4 + 7));
          parseThreeCommaList<double>(&local_170,&beta,&gamma,(double *)&option_index);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ex_4 + 7));
        }
        else {
          if (output_xyz.field_2._8_4_ == 0x76) {
            printVersion();
            argv_local._4_4_ = 0;
            local_ec = 1;
            goto LAB_001d5af1;
          }
          if (output_xyz.field_2._8_4_ != 0x7a) {
            argv_local._4_4_ = 1;
            local_ec = 1;
            goto LAB_001d5af1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_110,pcVar1,(allocator *)((long)&ex_2 + 7));
          parseThreeCommaList<double>(&local_110,&v,&w,&a);
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ex_2 + 7));
        }
      }
      goto LAB_001d4923;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,pcVar1,(allocator *)((long)&ex_5 + 7));
    parseThreeCommaList<double>(&local_1a0,&y,&z,&alpha);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ex_5 + 7));
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    verbose_flag = 0; // set the here to be 100% that it is zero
    bool fix = false;
    int cc;

    std::string output_xyz = "";
    std::string input_cif = "";
    double u, v, w, a, b, c, x, y, z, alpha, beta, gamma;
    u = v = w = a = b = c = x = y = z = alpha = beta  = gamma = 0;

    bool valid = true;

    while (true)
    {
        static struct option long_options[] =
                {
                        {"help",       no_argument,       nullptr,       'h'},
                        {"version",    no_argument,       nullptr,       'v'},
                        {"zone",       required_argument, nullptr,       'z'},
                        {"dimensions", required_argument, nullptr,       'd'},
                        {"output",     optional_argument, nullptr,       'o'},
                        {"normal",     optional_argument, nullptr,       'n'},
                        {"tilt",       optional_argument, nullptr,       't'},
                        {"fix",       no_argument, nullptr,       'f'},
                        {"verbose",    no_argument,       &verbose_flag, 1},
                        {nullptr,      0,                 nullptr,       0}
                };
        // getopt_long stores the option index here.
        int option_index = 0;
        cc = getopt_long (argc, argv, "fhvz:d:o:n:t:", long_options, &option_index);

        // Detect the end of the options.
        if (cc == -1)
            break;

        switch (cc)
        {
            case 0:
                break;
            case 'h':
                printHelp();
                return 0;
            case 'v':
                printVersion();
                return 0;
            case 'o':
                output_xyz = optarg;
                break;
            case 'z':
                try {
                    parseThreeCommaList<double>(optarg, u, v, w);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse zone axis:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'n':
                try {
                    parseThreeCommaList<double>(optarg, a, b, c);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse normal vector:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 't':
                try {
                    parseThreeCommaList<double>(optarg, alpha, beta, gamma);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse tilt angles:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'd':
                try {
                    parseThreeCommaList<double>(optarg, x, y, z);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse superstructure dimensions:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'f':
                fix = true;
                break;
            case '?':
                // getopt_long already printed an error message.
                break;

            default:
                return 1;
        }
    }

    // do the input file (it's the only non option arg)

    // get the non option args
    std::vector<std::string> non_option_args;
    while (optind < argc)
        non_option_args.emplace_back(argv[optind++]);

    if (non_option_args.size() < 1) {
        std::cerr << "Error: Need one non-option argument (the input .cif)" << std::endl;
        valid = false;
    }


    if (non_option_args.size() > 1) {
        std::cerr << "Error: Only expecting one non-option argument (the input .cif). Instead got:" << std::endl;
        for (std::string& s : non_option_args)
            std::cerr << "\t" << s << std::endl;
        valid = false;
    }

    // this is where the input is actually set
    if (non_option_args.size() == 1)
        input_cif = non_option_args[0];

    if (u == 0 && v == 0 && w == 0)  {
        std::cerr << "Error: Did not get valid zone axis" << std::endl;
        valid = false;
    }

    if (x <= 0 || y <= 0 || z <= 0)  {
        std::cerr << "Error: Did not get valid superstructure dimensions" << std::endl;
        valid = false;
    }

    std::ifstream test_stream(input_cif);

    std::stringstream ss;
    ss << test_stream.rdbuf();
    test_stream.close();
    std::string file = ss.str();

    if (file.empty()) {
        std::cerr << "Error: Invalid input .cif file" << std::endl;
        valid = false;
    }

    if (!valid)
        return 1;
    // we now have everything we need in some form. Need to verify the file/directory now.s

    // output file:
    // if we were not give an output file, use the input file (but change the extension)
    if (output_xyz.empty())
    {
        output_xyz = input_cif;
        if (endsWith(output_xyz, ".cif"))
            output_xyz = removeEnd(output_xyz, 4) + ".xyz";
    }

    // else just go with it, but append xyz if it doesnt have it already.
    if (!endsWith(output_xyz, ".xyz"))
        output_xyz += ".xyz";


    if (verbose_flag) {
        std::cout << "Verbose flag is set" << std::endl << std::endl;
    }

    std::shared_ptr<CIF::Reader> cif;

    try {
        cif = std::make_shared<CIF::Reader>(input_cif, fix);
    } catch (const std::exception& ex) {
        std::cerr << "Error: could not read cif file:\n\t" << ex.what() << std::endl;
        return 1;
    }

    CIF::SuperCellInfo si;
    si.setUVW(u, v, w);
    si.setABC(a, b, c);
    si.setWidths(x, y, z);
    si.setTilts(alpha, beta, gamma);

    try {
        makeXYZ(*cif, output_xyz, si);
    } catch (const std::exception& ex) {
        std::cerr << "Error: could not create superstructure:\n\t" << ex.what() << std::endl;
        return 1;
    }

    return 0;
}